

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

BasicType __thiscall
wasm::Random::pick<wasm::Type::BasicType>
          (Random *this,FeatureOptions<wasm::Type::BasicType> *picker)

{
  BasicType BVar1;
  value_type *pvVar2;
  vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_> local_30;
  FeatureOptions<wasm::Type::BasicType> *local_18;
  FeatureOptions<wasm::Type::BasicType> *picker_local;
  Random *this_local;
  
  local_18 = picker;
  picker_local = (FeatureOptions<wasm::Type::BasicType> *)this;
  items<wasm::Type::BasicType>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>>>
                     (this,&local_30);
  BVar1 = *pvVar2;
  std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>::~vector(&local_30);
  return BVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }